

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O2

void update_player0_subwindow(game_event_type type,game_event_data *data,void *user)

{
  term *t;
  
  t = Term;
  Term_activate((term *)user);
  display_player(L'\0');
  Term_fresh();
  Term_activate(t);
  return;
}

Assistant:

static void update_player0_subwindow(game_event_type type,
									 game_event_data *data, void *user)
{
	term *old = Term;
	term *inv_term = user;

	/* Activate */
	Term_activate(inv_term);

	/* Display flags */
	display_player(0);

	Term_fresh();
	
	/* Restore */
	Term_activate(old);
}